

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O0

void __thiscall FIX::FileLog::backup(FileLog *this)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  ostream *poVar3;
  char *pcVar4;
  FILE *pFVar5;
  char *pcVar6;
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  FILE *local_368;
  FILE *eventLogFile;
  FILE *local_340;
  FILE *messagesLogFile;
  stringstream local_328 [8];
  stringstream eventFileName;
  ostream local_318 [376];
  stringstream local_1a0 [8];
  stringstream messagesFileName;
  ostream local_190 [380];
  int local_14;
  FileLog *pFStack_10;
  int i;
  FileLog *this_local;
  
  pFStack_10 = this;
  std::ofstream::close();
  std::ofstream::close();
  local_14 = 0;
  do {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__cxx11::stringstream::stringstream(local_328);
    poVar3 = std::operator<<(local_190,(string *)&this->m_fullBackupPrefix);
    poVar3 = std::operator<<(poVar3,"messages.backup.");
    local_14 = local_14 + 1;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
    std::operator<<(poVar3,".log");
    poVar3 = std::operator<<(local_318,(string *)&this->m_fullBackupPrefix);
    poVar3 = std::operator<<(poVar3,"event.backup.");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
    std::operator<<(poVar3,".log");
    std::__cxx11::stringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pFVar5 = file_fopen(pcVar4,"r");
    std::__cxx11::string::~string((string *)&eventLogFile);
    local_340 = pFVar5;
    std::__cxx11::stringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pFVar5 = file_fopen(pcVar4,"r");
    std::__cxx11::string::~string(local_388);
    local_368 = pFVar5;
    if ((local_340 == (FILE *)0x0) && (pFVar5 == (FILE *)0x0)) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      file_rename(pcVar4,pcVar6);
      std::__cxx11::string::~string(local_3a8);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      file_rename(pcVar4,pcVar6);
      std::__cxx11::string::~string(local_3c8);
      _Var2 = std::__cxx11::string::c_str();
      std::operator|(_S_out,_S_trunc);
      std::ofstream::open((char *)&this->m_messages,_Var2);
      _Var2 = std::__cxx11::string::c_str();
      std::operator|(_S_out,_S_trunc);
      std::ofstream::open((char *)&this->m_event,_Var2);
      bVar1 = true;
    }
    else {
      if (local_340 != (FILE *)0x0) {
        file_fclose(local_340);
      }
      if (local_368 != (FILE *)0x0) {
        file_fclose(local_368);
      }
      bVar1 = false;
    }
    std::__cxx11::stringstream::~stringstream(local_328);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  } while (!bVar1);
  return;
}

Assistant:

void FileLog::backup()
{
  m_messages.close();
  m_event.close();

  int i = 0;
  while( true )
  {
    std::stringstream messagesFileName;
    std::stringstream eventFileName;

    messagesFileName << m_fullBackupPrefix << "messages.backup." << ++i << ".log";
    eventFileName << m_fullBackupPrefix << "event.backup." << i << ".log";
    FILE* messagesLogFile = file_fopen( messagesFileName.str().c_str(), "r" );
    FILE* eventLogFile = file_fopen( eventFileName.str().c_str(), "r" );

    if( messagesLogFile == NULL && eventLogFile == NULL )
    {
      file_rename( m_messagesFileName.c_str(), messagesFileName.str().c_str() );
      file_rename( m_eventFileName.c_str(), eventFileName.str().c_str() );
      m_messages.open( m_messagesFileName.c_str(), std::ios::out | std::ios::trunc );
      m_event.open( m_eventFileName.c_str(), std::ios::out | std::ios::trunc );
      return;
    }

    if( messagesLogFile != NULL ) file_fclose( messagesLogFile );
    if( eventLogFile != NULL ) file_fclose( eventLogFile );
  }
}